

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Promise<kj::String> __thiscall
kj::Promise<kj::String>::attach<kj::Own<kj::AsyncInputStream>>
          (Promise<kj::String> *this,Own<kj::AsyncInputStream> *attachments)

{
  AsyncInputStream *pAVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long *in_RDX;
  AttachmentPromiseNode<kj::Own<kj::AsyncInputStream>_> *pAVar4;
  AttachmentPromiseNode<kj::Own<kj::AsyncInputStream>_> *extraout_RDX;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::AsyncInputStream>_>_> OVar5;
  Promise<kj::String> PVar6;
  Own<kj::AsyncInputStream> local_28;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  local_28.disposer = (Disposer *)*in_RDX;
  local_28.ptr = (AsyncInputStream *)in_RDX[1];
  in_RDX[1] = 0;
  OVar5 = heap<kj::_::AttachmentPromiseNode<kj::Own<kj::AsyncInputStream>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::AsyncInputStream>>
                    ((kj *)&local_18,(Own<kj::_::PromiseNode> *)attachments,&local_28);
  pAVar1 = local_28.ptr;
  pAVar4 = OVar5.ptr;
  uVar2 = (undefined4)uStack_10;
  uVar3 = uStack_10._4_4_;
  uStack_10 = 0;
  *(undefined4 *)&(this->super_PromiseBase).node.disposer = local_18;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.disposer + 4) = uStack_14;
  *(undefined4 *)&(this->super_PromiseBase).node.ptr = uVar2;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.ptr + 4) = uVar3;
  if (local_28.ptr != (AsyncInputStream *)0x0) {
    local_28.ptr = (AsyncInputStream *)0x0;
    (**(local_28.disposer)->_vptr_Disposer)
              (local_28.disposer,
               pAVar1->_vptr_AsyncInputStream[-2] + (long)&pAVar1->_vptr_AsyncInputStream);
    pAVar4 = extraout_RDX;
  }
  PVar6.super_PromiseBase.node.ptr = (PromiseNode *)pAVar4;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::String>)PVar6.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}